

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

char * __thiscall
cppcms::impl::url_rewriter::rewrite(url_rewriter *this,char *url,string_pool *pool)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  pointer prVar4;
  ulong uVar5;
  cmatch m;
  cmatch local_58;
  
  local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.begin_ = (char *)0x0;
  local_58.end_ = (char *)0x0;
  local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prVar4 = (this->rules_).
           super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rules_).
      super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      bVar1 = booster::regex_match<booster::regex>(url,&local_58,&prVar4->expression + lVar3,0);
      bVar2 = 1;
      if (bVar1) {
        url = rule::rewrite_once((rule *)(&prVar4->expression + lVar3),&local_58,pool);
        bVar2 = (&prVar4->final)[lVar3] ^ 1;
      }
      if (bVar2 == 0) break;
      uVar5 = uVar5 + 1;
      prVar4 = (this->rules_).
               super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x48;
    } while (uVar5 < (ulong)(((long)(this->rules_).
                                    super__Vector_base<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)prVar4 >> 3)
                            * -0x71c71c71c71c71c7));
  }
  if (local_58.offsets_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.offsets_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return url;
}

Assistant:

char *rewrite(char *url,string_pool &pool) const
	{
		booster::cmatch m;
		for(size_t i=0;i<rules_.size();i++) {
			rule const &r = rules_[i];
			if(booster::regex_match(url,m,r.expression)) {
				url = r.rewrite_once(m,pool);
				if(r.final)
					break;
			}
		}
		return url;
	}